

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<iutest::detail::iuFilePath,char[3]>
          (string *__return_storage_ptr__,internal *this,iuFilePath *value,char (*param_2) [3])

{
  iu_global_format_stringstream strm;
  undefined1 auStack_198 [128];
  ios_base local_118 [264];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)auStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(auStack_198 + 0x10),*(char **)this,*(long *)(this + 8));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)auStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}